

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::make_exception<const_char_*,_unsigned_long>::operator()
          (make_exception<const_char_*,_unsigned_long> *this,stringstream *msg,char *arg,
          unsigned_long args)

{
  std::operator<<((ostream *)(msg + 0x10),arg);
  std::ostream::_M_insert<unsigned_long>((ulong)(msg + 0x10));
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }